

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O3

int32_t uprv_ebcdicFromAscii_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  byte bVar1;
  UErrorCode UVar2;
  ulong uVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  
  iVar4 = 0;
  iVar5 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar5 = iVar4, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR))
  {
    UVar2 = U_ILLEGAL_ARGUMENT_ERROR;
    if ((length < 0 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       (length != 0 && outData == (void *)0x0)) {
LAB_0010ddb8:
      *pErrorCode = UVar2;
      iVar5 = iVar4;
    }
    else if (length != 0) {
      iVar6 = length + 1;
      uVar3 = 0;
      do {
        bVar1 = *(byte *)((long)inData + uVar3);
        if (((char)bVar1 < '\0') ||
           ((invariantChars[bVar1 >> 5] >> ((int)(char)bVar1 & 0x1fU) & 1) == 0)) {
          udata_printError_63(ds,
                              "uprv_ebcdicFromAscii() string[%d] contains a variant character in position %d\n"
                              ,length,uVar3 & 0xffffffff);
          UVar2 = U_INVALID_CHAR_FOUND;
          goto LAB_0010ddb8;
        }
        *(uint8_t *)((long)outData + uVar3) = ""[(int)(char)bVar1];
        uVar3 = uVar3 + 1;
        iVar6 = iVar6 + -1;
        iVar5 = length;
      } while (1 < iVar6);
    }
  }
  return iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_ebcdicFromAscii(const UDataSwapper *ds,
                     const void *inData, int32_t length, void *outData,
                     UErrorCode *pErrorCode) {
    const uint8_t *s;
    uint8_t *t;
    uint8_t c;

    int32_t count;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    s=(const uint8_t *)inData;
    t=(uint8_t *)outData;
    count=length;
    while(count>0) {
        c=*s++;
        if(!UCHAR_IS_INVARIANT(c)) {
            udata_printError(ds, "uprv_ebcdicFromAscii() string[%d] contains a variant character in position %d\n",
                             length, length-count);
            *pErrorCode=U_INVALID_CHAR_FOUND;
            return 0;
        }
        *t++=ebcdicFromAscii[c];
        --count;
    }

    return length;
}